

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_ErrorMgr.cpp
# Opt level: O2

StringRef * __thiscall
axl::err::ErrorMgr::getErrorDescription
          (StringRef *__return_storage_ptr__,ErrorMgr *this,ErrorRef *error)

{
  int iVar1;
  undefined4 extraout_var;
  ErrorProvider *pEVar2;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_58;
  StringRef local_38;
  
  if (this->m_router == (ErrorRouter *)0x0) {
    pEVar2 = findProvider(this,&((error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).
                                m_p)->m_guid);
    if (pEVar2 == (ErrorProvider *)0x0) {
      sl::Guid::getString((String *)&local_58,
                          &((error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).m_p)->
                           m_guid,0);
      if (local_58.m_length == 0) {
        local_58.m_p = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      sl::formatString((String *)&local_38,"%s::%d",local_58.m_p,
                       (ulong)((error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).m_p)
                              ->m_code);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                (__return_storage_ptr__,&local_38);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_38);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_58);
    }
    else {
      (**pEVar2->_vptr_ErrorProvider)(__return_storage_ptr__,pEVar2,error);
    }
  }
  else {
    iVar1 = (*this->m_router->_vptr_ErrorRouter[1])();
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (__return_storage_ptr__,(C *)CONCAT44(extraout_var,iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

sl::StringRef
ErrorMgr::getErrorDescription(const ErrorRef& error) {
	if (m_router)
		return m_router->routeErrorDescription(error);

	ErrorProvider* provider = findProvider(error->m_guid);

	return provider ?
		provider->getErrorDescription(error) :
		sl::formatString("%s::%d", error->m_guid.getString().sz(), error->m_code);
}